

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConditionalStatements.h
# Opt level: O0

void __thiscall
slang::ast::ConditionalStatement::visitExprs<slang::ast::CheckerMemberVisitor&>
          (ConditionalStatement *this,CheckerMemberVisitor *visitor)

{
  bool bVar1;
  iterator this_00;
  iterator visitor_00;
  Condition *cond;
  iterator __end3;
  iterator __begin3;
  span<const_slang::ast::ConditionalStatement::Condition,_18446744073709551615UL> *__range3;
  CheckerMemberVisitor *in_stack_ffffffffffffffc8;
  Expression *in_stack_ffffffffffffffd0;
  span<const_slang::ast::ConditionalStatement::Condition,_18446744073709551615UL>
  *in_stack_ffffffffffffffd8;
  
  this_00 = std::span<const_slang::ast::ConditionalStatement::Condition,_18446744073709551615UL>::
            begin((span<const_slang::ast::ConditionalStatement::Condition,_18446744073709551615UL> *
                  )in_stack_ffffffffffffffc8);
  visitor_00 = std::span<const_slang::ast::ConditionalStatement::Condition,_18446744073709551615UL>
               ::end(in_stack_ffffffffffffffd8);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_slang::ast::ConditionalStatement::Condition_*,_std::span<const_slang::ast::ConditionalStatement::Condition,_18446744073709551615UL>_>
                      ((__normal_iterator<const_slang::ast::ConditionalStatement::Condition_*,_std::span<const_slang::ast::ConditionalStatement::Condition,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffffd0,
                       (__normal_iterator<const_slang::ast::ConditionalStatement::Condition_*,_std::span<const_slang::ast::ConditionalStatement::Condition,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffffc8);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    in_stack_ffffffffffffffd0 =
         (Expression *)
         __gnu_cxx::
         __normal_iterator<const_slang::ast::ConditionalStatement::Condition_*,_std::span<const_slang::ast::ConditionalStatement::Condition,_18446744073709551615UL>_>
         ::operator*((__normal_iterator<const_slang::ast::ConditionalStatement::Condition_*,_std::span<const_slang::ast::ConditionalStatement::Condition,_18446744073709551615UL>_>
                      *)&stack0xffffffffffffffe0);
    not_null<const_slang::ast::Expression_*>::operator->
              ((not_null<const_slang::ast::Expression_*> *)0x8f90ea);
    Expression::visit<slang::ast::CheckerMemberVisitor&>
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    if ((in_stack_ffffffffffffffd0->type).ptr != (Type *)0x0) {
      Pattern::visit<slang::ast::CheckerMemberVisitor>
                ((Pattern *)this_00._M_current,(CheckerMemberVisitor *)visitor_00._M_current);
    }
    __gnu_cxx::
    __normal_iterator<const_slang::ast::ConditionalStatement::Condition_*,_std::span<const_slang::ast::ConditionalStatement::Condition,_18446744073709551615UL>_>
    ::operator++((__normal_iterator<const_slang::ast::ConditionalStatement::Condition_*,_std::span<const_slang::ast::ConditionalStatement::Condition,_18446744073709551615UL>_>
                  *)&stack0xffffffffffffffe0);
  }
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        for (auto& cond : conditions) {
            cond.expr->visit(visitor);
            if (cond.pattern)
                cond.pattern->visit(visitor);
        }
    }